

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O0

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  float *pfVar4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  float *ptr_5;
  int j_1;
  Mat m;
  float *outptr_5;
  int p_1;
  Mat *top_blob_5;
  int slice_5;
  size_t i_5;
  int q_5;
  int channels_2;
  int h_4;
  int w_5;
  float *ptr_4;
  float *outptr_4;
  int size_2;
  int p;
  Mat *top_blob_4;
  int slice_4;
  size_t i_4;
  int q_4;
  int channels_1;
  int h_3;
  int w_4;
  float *outptr_3;
  float *ptr_3;
  int size_1;
  Mat *top_blob_3;
  int slice_3;
  size_t i_3;
  int q_3;
  int channels;
  int h_2;
  int w_3;
  float *ptr_2;
  float *outptr_2;
  int j;
  Mat *top_blob_2;
  int slice_2;
  size_t i_2;
  int q_2;
  int h_1;
  int w_2;
  float *outptr_1;
  float *ptr_1;
  int size;
  Mat *top_blob_1;
  int slice_1;
  size_t i_1;
  int q_1;
  int h;
  int w_1;
  float *outptr;
  float *ptr;
  Mat *top_blob;
  int slice;
  size_t i;
  int q;
  int w;
  int *slices_ptr;
  size_t elemsize;
  int dims;
  Mat *bottom_blob;
  Mat *in_stack_fffffffffffffc70;
  Mat *in_stack_fffffffffffffc78;
  ulong in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  ulong uVar5;
  Mat *in_stack_fffffffffffffc90;
  int local_2dc;
  Mat local_2d8;
  Mat local_2a0;
  Mat *local_268;
  int local_25c;
  reference local_258;
  int local_24c;
  ulong local_248;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  Mat local_230;
  float *local_1f8;
  Mat local_1f0;
  float *local_1b8;
  int local_1b0;
  int local_1ac;
  reference local_1a8;
  int local_19c;
  ulong local_198;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  float *local_180;
  Mat local_168;
  float *local_130;
  int local_124;
  reference local_120;
  int local_114;
  ulong local_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  float *local_f8;
  float *local_f0;
  int local_e4;
  reference local_e0;
  int local_d4;
  ulong local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  float *local_b8;
  float *local_b0;
  int local_a4;
  reference local_a0;
  int local_94;
  ulong local_90;
  int local_84;
  int local_80;
  int local_7c;
  float *local_78;
  float *local_70;
  reference local_68;
  int local_5c;
  ulong local_58;
  int local_50;
  int local_4c;
  int *local_48;
  size_t local_40;
  int local_34;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  
  local_20 = in_RDX;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_34 = local_30->dims;
  local_40 = local_30->elemsize;
  local_48 = Mat::operator_cast_to_int_((Mat *)(in_RDI + 0x80));
  if (local_34 == 1) {
    local_4c = local_30->w;
    local_50 = 0;
    for (local_58 = 0; uVar5 = local_58,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar5 < sVar3;
        local_58 = local_58 + 1) {
      local_5c = local_48[local_58];
      if (local_5c == -0xe9) {
        iVar2 = local_4c - local_50;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_5c = (int)((ulong)(long)iVar2 / (sVar3 - local_58));
      }
      local_68 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_58);
      Mat::create(in_stack_fffffffffffffc90,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                  in_stack_fffffffffffffc80,(Allocator *)in_stack_fffffffffffffc78);
      bVar1 = Mat::empty(in_stack_fffffffffffffc70);
      if (bVar1) {
        return -100;
      }
      local_70 = Mat::operator_cast_to_float_(local_30);
      local_70 = local_70 + local_50;
      local_78 = Mat::operator_cast_to_float_(local_68);
      memcpy(local_78,local_70,(long)local_5c * local_40);
      local_50 = local_5c + local_50;
    }
  }
  else if ((local_34 == 2) && (*(int *)(in_RDI + 0xb8) == 0)) {
    local_7c = local_30->w;
    local_80 = local_30->h;
    local_84 = 0;
    for (local_90 = 0; uVar5 = local_90,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar5 < sVar3;
        local_90 = local_90 + 1) {
      local_94 = local_48[local_90];
      if (local_94 == -0xe9) {
        iVar2 = local_80 - local_84;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_94 = (int)((ulong)(long)iVar2 / (sVar3 - local_90));
      }
      local_a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_90);
      Mat::create(in_stack_fffffffffffffc90,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                  (int)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                  (Allocator *)in_stack_fffffffffffffc78);
      bVar1 = Mat::empty(in_stack_fffffffffffffc70);
      if (bVar1) {
        return -100;
      }
      local_a4 = local_7c * local_94;
      local_b0 = Mat::row(local_30,local_84);
      local_b8 = Mat::operator_cast_to_float_(local_a0);
      memcpy(local_b8,local_b0,(long)local_a4 * local_40);
      local_84 = local_94 + local_84;
    }
  }
  else if ((local_34 == 2) && (*(int *)(in_RDI + 0xb8) == 1)) {
    local_bc = local_30->w;
    local_c0 = local_30->h;
    local_c4 = 0;
    for (local_d0 = 0; uVar5 = local_d0,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar5 < sVar3;
        local_d0 = local_d0 + 1) {
      local_d4 = local_48[local_d0];
      if (local_d4 == -0xe9) {
        iVar2 = local_bc - local_c4;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_d4 = (int)((ulong)(long)iVar2 / (sVar3 - local_d0));
      }
      local_e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_d0);
      Mat::create(in_stack_fffffffffffffc90,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                  (int)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                  (Allocator *)in_stack_fffffffffffffc78);
      bVar1 = Mat::empty(in_stack_fffffffffffffc70);
      if (bVar1) {
        return -100;
      }
      for (local_e4 = 0; local_e4 < local_c0; local_e4 = local_e4 + 1) {
        local_f0 = Mat::row(local_e0,local_e4);
        local_f8 = Mat::row(local_30,local_e4);
        local_f8 = local_f8 + local_c4;
        memcpy(local_f0,local_f8,(long)local_d4 * local_40);
      }
      local_c4 = local_d4 + local_c4;
    }
  }
  else if ((local_34 == 3) && (*(int *)(in_RDI + 0xb8) == 0)) {
    local_fc = local_30->w;
    local_100 = local_30->h;
    local_104 = local_30->c;
    local_108 = 0;
    for (local_110 = 0; uVar5 = local_110,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar5 < sVar3;
        local_110 = local_110 + 1) {
      local_114 = local_48[local_110];
      if (local_114 == -0xe9) {
        iVar2 = local_104 - local_108;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_114 = (int)((ulong)(long)iVar2 / (sVar3 - local_110));
      }
      local_120 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_110)
      ;
      Mat::create(in_stack_fffffffffffffc90,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                  (int)in_stack_fffffffffffffc88,(int)(in_stack_fffffffffffffc80 >> 0x20),
                  (size_t)in_stack_fffffffffffffc78,(Allocator *)in_stack_fffffffffffffc70);
      bVar1 = Mat::empty(in_stack_fffffffffffffc70);
      if (bVar1) {
        return -100;
      }
      local_124 = (int)local_30->cstep * local_114;
      Mat::channel(in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
      pfVar4 = Mat::operator_cast_to_float_(&local_168);
      Mat::~Mat((Mat *)0x130c22);
      local_130 = pfVar4;
      local_180 = Mat::operator_cast_to_float_(local_120);
      memcpy(local_180,local_130,(long)local_124 * local_40);
      local_108 = local_114 + local_108;
    }
  }
  else if ((local_34 == 3) && (*(int *)(in_RDI + 0xb8) == 1)) {
    local_184 = local_30->w;
    local_188 = local_30->h;
    local_18c = local_30->c;
    local_190 = 0;
    for (local_198 = 0; uVar5 = local_198,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar5 < sVar3;
        local_198 = local_198 + 1) {
      local_19c = local_48[local_198];
      if (local_19c == -0xe9) {
        iVar2 = local_188 - local_190;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_19c = (int)((ulong)(long)iVar2 / (sVar3 - local_198));
      }
      local_1a8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_198)
      ;
      Mat::create(in_stack_fffffffffffffc90,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                  (int)in_stack_fffffffffffffc88,(int)(in_stack_fffffffffffffc80 >> 0x20),
                  (size_t)in_stack_fffffffffffffc78,(Allocator *)in_stack_fffffffffffffc70);
      bVar1 = Mat::empty(in_stack_fffffffffffffc70);
      if (bVar1) {
        return -100;
      }
      for (local_1ac = 0; local_1ac < local_18c; local_1ac = local_1ac + 1) {
        local_1b0 = local_184 * local_19c;
        Mat::channel(in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
        pfVar4 = Mat::operator_cast_to_float_(&local_1f0);
        Mat::~Mat((Mat *)0x130eba);
        in_stack_fffffffffffffc90 = &local_230;
        local_1b8 = pfVar4;
        Mat::channel(in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
        pfVar4 = Mat::row(in_stack_fffffffffffffc90,local_190);
        Mat::~Mat((Mat *)0x130f0d);
        local_1f8 = pfVar4;
        memcpy(local_1b8,pfVar4,(long)local_1b0 * local_40);
      }
      local_190 = local_19c + local_190;
    }
  }
  else if ((local_34 == 3) && (*(int *)(in_RDI + 0xb8) == 2)) {
    local_234 = local_30->w;
    local_238 = local_30->h;
    local_23c = local_30->c;
    local_240 = 0;
    local_248 = 0;
    while (uVar5 = local_248,
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20), uVar5 < sVar3)
    {
      local_24c = local_48[local_248];
      if (local_24c == -0xe9) {
        in_stack_fffffffffffffc80 = (ulong)(local_234 - local_240);
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
        local_24c = (int)(in_stack_fffffffffffffc80 / (sVar3 - local_248));
      }
      local_258 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,local_248)
      ;
      Mat::create(in_stack_fffffffffffffc90,(int)(uVar5 >> 0x20),(int)uVar5,
                  (int)(in_stack_fffffffffffffc80 >> 0x20),(size_t)in_stack_fffffffffffffc78,
                  (Allocator *)in_stack_fffffffffffffc70);
      bVar1 = Mat::empty(in_stack_fffffffffffffc70);
      if (bVar1) {
        return -100;
      }
      for (local_25c = 0; local_25c < local_23c; local_25c = local_25c + 1) {
        in_stack_fffffffffffffc70 = &local_2a0;
        Mat::channel(in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
        in_stack_fffffffffffffc78 = (Mat *)Mat::operator_cast_to_float_(in_stack_fffffffffffffc70);
        Mat::~Mat((Mat *)0x1311b4);
        local_268 = in_stack_fffffffffffffc78;
        Mat::channel(in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
        for (local_2dc = 0; local_2dc < local_238; local_2dc = local_2dc + 1) {
          pfVar4 = Mat::row(&local_2d8,local_2dc);
          memcpy(local_268,pfVar4 + local_240,(long)local_24c * local_40);
          local_268 = (Mat *)((long)&local_268->data + (long)local_24c * 4);
        }
        Mat::~Mat((Mat *)0x1312e4);
      }
      local_240 = local_24c + local_240;
      local_248 = local_248 + 1;
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;

    if (dims == 1) // axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const float* ptr = bottom_blob.row(q);
            float* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j=0; j<h; j++)
            {
                float* outptr = top_blob.row(j);
                const float* ptr = bottom_blob.row(j) + q;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = bottom_blob.cstep * slice;

            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                int size = w * slice;

                float* outptr = top_blob.channel(p);
                const float* ptr = bottom_blob.channel(p).row(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                float* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j=0; j<h; j++)
                {
                    const float* ptr = m.row(j) + q;
                    memcpy(outptr, ptr, slice * elemsize);

                    outptr += slice;
                }
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}